

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O3

void kmpp_objs_deinit(void)

{
  KmppObjs *ptr;
  int iVar1;
  KmppObjs *pKVar2;
  long lVar3;
  
  ptr = objs;
  LOCK();
  objs = (KmppObjs *)0x0;
  UNLOCK();
  if (((byte)kmpp_obj_debug & 1) != 0) {
    _mpp_log_l(4,"kmpp_obj","kmpp_objs_deinit objs %p\n",(char *)0x0,ptr);
  }
  if (ptr != (KmppObjs *)0x0) {
    iVar1 = ptr->count;
    if (0 < iVar1) {
      pKVar2 = ptr + 1;
      lVar3 = 0;
      do {
        if (*(MppTrie *)pKVar2 != (MppTrie)0x0) {
          mpp_trie_deinit(*(MppTrie *)pKVar2);
          pKVar2->fd = 0;
          pKVar2->count = 0;
          iVar1 = ptr->count;
        }
        lVar3 = lVar3 + 1;
        pKVar2 = (KmppObjs *)&pKVar2->root;
      } while (lVar3 < iVar1);
    }
    if (ptr->trie != (MppTrie)0x0) {
      mpp_trie_deinit(ptr->trie);
      ptr->trie = (MppTrie)0x0;
    }
    if (0 < ptr->fd) {
      close(ptr->fd);
      ptr->fd = -1;
    }
    mpp_osal_free("kmpp_objs_deinit",ptr);
    return;
  }
  return;
}

Assistant:

__attribute__ ((destructor))
void kmpp_objs_deinit(void)
{
    KmppObjs *p = MPP_FETCH_AND(&objs, NULL);

    obj_dbg_flow("kmpp_objs_deinit objs %p\n", p);

    if (p) {
        rk_s32 i;

        for (i = 0; i < p->count; i++) {
            KmppObjDefImpl *impl = &p->defs[i];

            if (impl->trie) {
                mpp_trie_deinit(impl->trie);
                impl->trie = NULL;
            }
        }

        if (p->trie) {
            mpp_trie_deinit(p->trie);
            p->trie = NULL;
        }

        if (p->fd > 0) {
            close(p->fd);
            p->fd = -1;
        }

        mpp_free(p);
    }
}